

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall chrono::ChBody::VariablesFbLoadForces(ChBody *this,double factor)

{
  ChVariablesBodyOwnMass *this_00;
  long *plVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  ulong *puVar16;
  Index index;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  long in_XMM0_Qb;
  ChVector<double> v;
  undefined1 local_68 [16];
  double dStack_58;
  long lStack_50;
  double dStack_48;
  long lStack_40;
  long lStack_38;
  ChVectorRef CStack_30;
  
  this_00 = &this->variables;
  dStack_48 = factor;
  lStack_40 = in_XMM0_Qb;
  ChVariables::Get_fb((ChVectorRef *)local_68,(ChVariables *)this_00);
  if ((long)local_68._8_8_ < 3) goto LAB_005076c6;
  uVar17 = 3;
  if ((local_68 & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    uVar18 = -((uint)((ulong)local_68._0_8_ >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar18 < 3) {
      uVar17 = (ulong)uVar18;
    }
    if (uVar18 != 0) goto LAB_005074f1;
  }
  else {
LAB_005074f1:
    uVar20 = 0;
    do {
      *(double *)(local_68._0_8_ + uVar20 * 8) =
           dStack_48 * (this->Xforce).m_data[uVar20] + *(double *)(local_68._0_8_ + uVar20 * 8);
      uVar20 = uVar20 + 1;
    } while (uVar17 != uVar20);
  }
  if (uVar17 < 3) {
    do {
      *(double *)(local_68._0_8_ + uVar17 * 8) =
           dStack_48 * (this->Xforce).m_data[uVar17] + *(double *)(local_68._0_8_ + uVar17 * 8);
      uVar17 = uVar17 + 1;
    } while (uVar17 != 3);
  }
  if ((this->bflags & 0x800) != 0) {
    ChVariables::Get_fb((ChVectorRef *)local_68,(ChVariables *)this_00);
    if ((long)local_68._8_8_ < 6) goto LAB_005076c6;
    uVar17 = 3;
    uVar20 = local_68._0_8_ + 0x18;
    if ((uVar20 & 7) == 0) {
      uVar18 = -((uint)(uVar20 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar18 < 3) {
        uVar17 = (ulong)uVar18;
      }
      if (uVar18 == 0) goto LAB_00507697;
    }
    uVar21 = 0;
    do {
      *(double *)(uVar20 + uVar21 * 8) =
           dStack_48 * (this->Xtorque).m_data[uVar21] + *(double *)(uVar20 + uVar21 * 8);
      uVar21 = uVar21 + 1;
    } while (uVar17 != uVar21);
LAB_00507697:
    if (2 < uVar17) {
      return;
    }
    do {
      *(double *)(uVar20 + uVar17 * 8) =
           dStack_48 * (this->Xtorque).m_data[uVar17] + *(double *)(uVar20 + uVar17 * 8);
      uVar17 = uVar17 + 1;
    } while (uVar17 != 3);
    return;
  }
  local_68 = vsubpd_avx(*(undefined1 (*) [16])(this->Xtorque).m_data,
                        *(undefined1 (*) [16])(this->gyro).m_data);
  dStack_58 = (this->Xtorque).m_data[2] - (this->gyro).m_data[2];
  ChVariables::Get_fb(&CStack_30,(ChVariables *)this_00);
  if ((long)CStack_30.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ < 6) {
LAB_005076c6:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  auVar15._8_8_ = lStack_40;
  auVar15._0_8_ = dStack_48;
  uVar18 = 3;
  puVar16 = (ulong *)(CStack_30.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ._0_8_ + 0x18);
  if (((ulong)puVar16 & 7) == 0) {
    uVar19 = -((uint)((ulong)puVar16 >> 3) & 0x1fffffff) & 7;
    if (uVar19 < 3) {
      uVar18 = uVar19;
    }
    if (uVar19 == 0) goto LAB_005075eb;
  }
  auVar23 = vbroadcastsd_avx512f(auVar15);
  auVar24 = vpbroadcastq_avx512f();
  uVar17 = vpcmpuq_avx512f(auVar24,_DAT_00955200,5);
  bVar2 = (byte)uVar17;
  auVar24._8_8_ = (ulong)((byte)(uVar17 >> 1) & 1) * local_68._8_8_;
  auVar24._0_8_ = (ulong)(bVar2 & 1) * local_68._0_8_;
  auVar24._16_8_ = (ulong)((byte)(uVar17 >> 2) & 1) * (long)dStack_58;
  auVar24._24_8_ = (ulong)((byte)(uVar17 >> 3) & 1) * lStack_50;
  auVar24._32_8_ = (ulong)((byte)(uVar17 >> 4) & 1) * (long)dStack_48;
  auVar24._40_8_ = (ulong)((byte)(uVar17 >> 5) & 1) * lStack_40;
  auVar24._48_8_ = (ulong)((byte)(uVar17 >> 6) & 1) * lStack_38;
  auVar24._56_8_ =
       (uVar17 >> 7) *
       CStack_30.
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
       ._0_8_;
  auVar25._8_8_ =
       (ulong)((byte)(uVar17 >> 1) & 1) *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x20);
  auVar25._0_8_ = (ulong)(bVar2 & 1) * *puVar16;
  auVar25._16_8_ =
       (ulong)((byte)(uVar17 >> 2) & 1) *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x28);
  auVar25._24_8_ =
       (ulong)((byte)(uVar17 >> 3) & 1) *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x30);
  auVar25._32_8_ =
       (ulong)((byte)(uVar17 >> 4) & 1) *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x38);
  auVar25._40_8_ =
       (ulong)((byte)(uVar17 >> 5) & 1) *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x40);
  auVar25._48_8_ =
       (ulong)((byte)(uVar17 >> 6) & 1) *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x48);
  auVar25._56_8_ =
       (uVar17 >> 7) *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x50);
  auVar23 = vmulpd_avx512f(auVar24,auVar23);
  auVar23 = vaddpd_avx512f(auVar23,auVar25);
  bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
  bVar4 = (bool)((byte)(uVar17 >> 2) & 1);
  bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
  bVar6 = (bool)((byte)(uVar17 >> 4) & 1);
  bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
  bVar8 = (bool)((byte)(uVar17 >> 6) & 1);
  *puVar16 = (ulong)(bVar2 & 1) * auVar23._0_8_ | (ulong)!(bool)(bVar2 & 1) * *puVar16;
  *(ulong *)(CStack_30.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x20) =
       (ulong)bVar3 * auVar23._8_8_ |
       (ulong)!bVar3 *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x20);
  *(ulong *)(CStack_30.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x28) =
       (ulong)bVar4 * auVar23._16_8_ |
       (ulong)!bVar4 *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x28);
  *(ulong *)(CStack_30.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x30) =
       (ulong)bVar5 * auVar23._24_8_ |
       (ulong)!bVar5 *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x30);
  *(ulong *)(CStack_30.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x38) =
       (ulong)bVar6 * auVar23._32_8_ |
       (ulong)!bVar6 *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x38);
  *(ulong *)(CStack_30.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x40) =
       (ulong)bVar7 * auVar23._40_8_ |
       (ulong)!bVar7 *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x40);
  *(ulong *)(CStack_30.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x48) =
       (ulong)bVar8 * auVar23._48_8_ |
       (ulong)!bVar8 *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x48);
  *(ulong *)(CStack_30.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x50) =
       (uVar17 >> 7) * auVar23._56_8_ |
       (ulong)!SUB81(uVar17 >> 7,0) *
       *(long *)(CStack_30.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + 0x50);
LAB_005075eb:
  if (uVar18 < 3) {
    uVar20 = (ulong)(uVar18 << 3);
    auVar22 = vpbroadcastq_avx512vl();
    uVar17 = vpcmpuq_avx512vl(auVar22,_DAT_00955380,5);
    uVar17 = uVar17 & 0xf;
    lVar9 = *(long *)(local_68 + uVar20 + 8);
    lVar10 = *(long *)((long)&dStack_58 + uVar20);
    lVar11 = *(long *)((long)&lStack_50 + uVar20);
    bVar2 = (byte)uVar17;
    plVar1 = (long *)((long)puVar16 + uVar20);
    lVar12 = plVar1[1];
    lVar13 = plVar1[2];
    lVar14 = plVar1[3];
    puVar16 = (ulong *)((long)puVar16 + uVar20);
    bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar17 >> 2) & 1);
    *puVar16 = (ulong)(bVar2 & 1) *
               (long)((double)((ulong)(bVar2 & 1) * *(long *)(local_68 + uVar20)) * dStack_48 +
                     (double)((ulong)(bVar2 & 1) * *plVar1)) | (ulong)!(bool)(bVar2 & 1) * *puVar16;
    puVar16[1] = (ulong)bVar3 *
                 (long)((double)((ulong)((byte)(uVar17 >> 1) & 1) * lVar9) * dStack_48 +
                       (double)((ulong)((byte)(uVar17 >> 1) & 1) * lVar12)) |
                 (ulong)!bVar3 * puVar16[1];
    puVar16[2] = (ulong)bVar4 *
                 (long)((double)((ulong)((byte)(uVar17 >> 2) & 1) * lVar10) * dStack_48 +
                       (double)((ulong)((byte)(uVar17 >> 2) & 1) * lVar13)) |
                 (ulong)!bVar4 * puVar16[2];
    puVar16[3] = (uVar17 >> 3) *
                 (long)((double)((uVar17 >> 3) * lVar11) * dStack_48 +
                       (double)((uVar17 >> 3) * lVar14)) | (ulong)!SUB81(uVar17 >> 3,0) * puVar16[3]
    ;
  }
  return;
}

Assistant:

void ChBody::VariablesFbLoadForces(double factor) {
    // add applied forces to 'fb' vector
    this->variables.Get_fb().segment(0, 3) += factor * Xforce.eigen();

    // add applied torques to 'fb' vector, including gyroscopic torque
    if (this->GetNoGyroTorque())
        this->variables.Get_fb().segment(3, 3) += factor * Xtorque.eigen();
    else
        this->variables.Get_fb().segment(3, 3) += factor * (Xtorque - gyro).eigen();
}